

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_file_hash_dictionary_handler.c
# Opt level: O0

ion_err_t oafdict_create_dictionary
                    (ion_dictionary_id_t id,ion_key_type_t key_type,ion_key_size_t key_size,
                    ion_value_size_t value_size,ion_dictionary_size_t dictionary_size,
                    ion_dictionary_compare_t compare,ion_dictionary_handler_t *handler,
                    ion_dictionary_t *dictionary)

{
  ion_dictionary_parent_t *piVar1;
  ion_dictionary_compare_t compare_local;
  ion_dictionary_size_t dictionary_size_local;
  ion_value_size_t value_size_local;
  ion_key_size_t key_size_local;
  ion_key_type_t key_type_local;
  ion_dictionary_id_t id_local;
  
  piVar1 = (ion_dictionary_parent_t *)malloc(0x38);
  dictionary->instance = piVar1;
  dictionary->instance->compare = compare;
  dictionary->instance->type = dictionary_type_open_address_file_hash_t;
  oafh_initialize((ion_file_hashmap_t *)dictionary->instance,oafh_compute_simple_hash,key_type,
                  key_size,value_size,dictionary_size,id);
  if (handler == (ion_dictionary_handler_t *)0x0) {
    key_type_local._3_1_ = 0x12;
  }
  else {
    dictionary->handler = handler;
    key_type_local._3_1_ = key_type_numeric_signed >> 0x18;
  }
  return key_type_local._3_1_;
}

Assistant:

ion_err_t
oafdict_create_dictionary(
	ion_dictionary_id_t			id,
	ion_key_type_t				key_type,
	ion_key_size_t				key_size,
	ion_value_size_t			value_size,
	ion_dictionary_size_t		dictionary_size,
	ion_dictionary_compare_t	compare,
	ion_dictionary_handler_t	*handler,
	ion_dictionary_t			*dictionary
) {
	UNUSED(id);
	/* this is the instance of the hashmap */
	dictionary->instance			= malloc(sizeof(ion_file_hashmap_t));

	dictionary->instance->compare	= compare;
	dictionary->instance->type		= dictionary_type_open_address_file_hash_t;

	/* this registers the dictionary the dictionary */
	oafh_initialize((ion_file_hashmap_t *) dictionary->instance, oafh_compute_simple_hash, key_type, key_size, value_size, dictionary_size, id);/* just pick an arbitary size for testing atm */

	/*TODO The correct comparison operator needs to be bound at run time
	 * based on the type of key defined
	*/

	if (NULL == handler) {
		return err_uninitialized;
	}

	/* register the correct handler */
	dictionary->handler = handler;

	return 0;
}